

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O1

void __thiscall cpprofiler::Connector::restart(Connector *this,int restart_id)

{
  ostream *poVar1;
  string info;
  stringstream ss;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base aiStack_130 [264];
  
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\"restart_id\": ",0xe);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,restart_id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_1f0,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  (this->marshalling).msg._have_label = false;
  (this->marshalling).msg._have_nogood = false;
  (this->marshalling).msg._have_version = false;
  (this->marshalling).msg._type = RESTART;
  (this->marshalling).msg._have_info = true;
  std::__cxx11::string::_M_assign((string *)&(this->marshalling).msg._info);
  sendOverSocket(this);
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0]);
  }
  return;
}

Assistant:

void restart(int restart_id = -1) {

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"restart_id\": " << restart_id << "\n";
      ss << "}";
      info = ss.str();
    }

    marshalling.makeRestart(info);
    sendOverSocket();
  }